

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O1

void __thiscall MonahanPlanner::Plan(MonahanPlanner *this)

{
  size_t sVar1;
  pointer puVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  ostream *poVar10;
  PlanningUnitDecPOMDPDiscrete *pPVar11;
  StateDistribution *belief;
  MonahanPlanner *pMVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  QFunctionsDiscrete Qs;
  ValueFunctionPOMDPDiscrete immR;
  ValueFunctionPOMDPDiscrete Q0;
  AlphaVector alpha;
  Belief local_f8;
  QFunctionsDiscreteNonStationary *local_d0;
  undefined1 local_c8 [32];
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  local_a8;
  undefined1 local_90 [32];
  shared_count sStack_70;
  pointer local_68;
  pointer local_58;
  pointer pvStack_50;
  pointer local_48;
  
  if (this->_m_initialized == false) {
    (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[3])(this);
  }
  if (this->_m_alreadyComputed == false) {
    this->_m_alreadyComputed = true;
    pPVar11 = (this->super_AlphaVectorPlanning)._m_pu;
    if (pPVar11 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar11 = (this->super_AlphaVectorPlanning)._m_puShared.px;
    }
    sVar1 = (pPVar11->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
    uVar5 = (**(code **)((long)*(pPVar11->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
    pPVar11 = (this->super_AlphaVectorPlanning)._m_pu;
    if (pPVar11 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar11 = (this->super_AlphaVectorPlanning)._m_puShared.px;
    }
    sVar9 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar11->super_PlanningUnitMADPDiscrete);
    local_a8.
    super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar8 = (int)sVar1;
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
              *)&local_f8,(long)iVar8,(allocator_type *)local_c8);
    local_58 = (this->_m_qFunction).
               super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pvStack_50 = (this->_m_qFunction).
                 super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_48 = (this->_m_qFunction).
               super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->_m_qFunction).
    super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
    (this->_m_qFunction).
    super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_f8._m_b.super_StateDistribution._vptr_StateDistribution;
    (this->_m_qFunction).
    super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_f8._m_b.super_SDV.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._m_b.super_StateDistribution._vptr_StateDistribution = (_func_int **)0x0;
    local_f8._m_b.super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               *)&local_58);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               *)&local_f8);
    AlphaVector::AlphaVector((AlphaVector *)&local_58,(long)(int)sVar9);
    local_90._24_8_ = (element_type *)0x0;
    sStack_70.pi_ = (sp_counted_base *)0x0;
    local_68 = (pointer)0x0;
    pMVar12 = (MonahanPlanner *)local_90;
    AlphaVectorPlanning::GetImmediateRewardValueFunction
              ((ValueFunctionPOMDPDiscrete *)pMVar12,&this->super_AlphaVectorPlanning);
    uVar6 = iVar8 - 1;
    uVar13 = (ulong)(int)uVar6;
    puVar2 = (this->_m_maxNrAlphas).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = uVar13;
    if ((ulong)((long)(this->_m_maxNrAlphas).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar13) {
LAB_003ba1a0:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15)
      ;
    }
    CheckMaxNrVectors(pMVar12,puVar2[uVar13],
                      ((long)(local_90._8_8_ - local_90._0_8_) >> 3) * -0x3333333333333333);
    local_d0 = &this->_m_qFunction;
    *(uint *)&(this->super_AlphaVectorPlanning).field_0x12c = uVar6;
    if (0 < iVar8) {
      lVar4 = (ulong)uVar5 * 0x18;
      uVar7 = uVar6;
      do {
        if (uVar7 == uVar6) {
          AlphaVectorPlanning::ValueFunctionToQ
                    ((QFunctionsDiscrete *)&local_f8,&this->super_AlphaVectorPlanning,
                     (ValueFunctionPOMDPDiscrete *)local_90);
          if (uVar5 != 0) {
            lVar14 = 0;
            do {
              std::
              vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
              ::push_back((local_d0->
                          super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar13,
                          (value_type *)
                          ((long)&(((_Vector_base<AlphaVector,_std::allocator<AlphaVector>_> *)
                                   local_f8._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                          lVar14));
              lVar14 = lVar14 + 0x18;
            } while (lVar4 != lVar14);
          }
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     *)&local_f8);
        }
        else {
          uVar15 = (ulong)uVar7;
          puVar2 = (this->_m_maxNrAlphas).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->_m_maxNrAlphas).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar15
             ) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[2])
                    ((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                      *)local_c8,this,
                     (this->_m_qFunction).
                     super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar15 + 1,puVar2[uVar15]);
          local_f8._m_b.super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_a8.
                        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_f8._m_b.super_StateDistribution._vptr_StateDistribution =
               (_func_int **)
               local_a8.
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_f8._0_8_ =
               local_a8.
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_a8.
          super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
          local_a8.
          super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._8_8_;
          local_a8.
          super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._16_8_;
          local_c8._0_8_ = (pointer)0x0;
          local_c8._8_8_ = (pointer)0x0;
          local_c8._16_8_ = (pointer)0x0;
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     *)&local_f8);
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     *)local_c8);
          uVar15 = (ulong)*(int *)&(this->super_AlphaVectorPlanning).field_0x12c;
          puVar2 = (this->_m_maxNrAlphas).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->_m_maxNrAlphas).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar15
             ) goto LAB_003ba1a0;
          sVar1 = puVar2[uVar15];
          pMVar12 = this;
          sVar9 = GetNrVectors(this);
          CheckMaxNrVectors(pMVar12,sVar1,sVar9);
          if (uVar5 != 0) {
            lVar14 = 0;
            do {
              std::
              vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
              ::push_back((this->_m_qFunction).
                          super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          *(int *)&(this->super_AlphaVectorPlanning).field_0x12c,
                          (value_type *)
                          ((long)&((local_a8.
                                    super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar14));
              lVar14 = lVar14 + 0x18;
            } while (lVar4 != lVar14);
          }
        }
        (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[6])
                  (&local_f8,this);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_f8._0_8_,
                             (long)local_f8._m_b.super_StateDistribution._vptr_StateDistribution);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Planner: t ",0xb);
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             *(int *)&(this->super_AlphaVectorPlanning).field_0x12c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," contains <",0xb);
        if ((SDV *)local_f8._0_8_ != &local_f8._m_b.super_SDV) {
          operator_delete((void *)local_f8._0_8_,
                          (ulong)((long)&(((_Vector_base<AlphaVector,_std::allocator<AlphaVector>_>
                                            *)local_f8._m_b.super_SDV.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                         super__Vector_impl_data._M_start + 1));
        }
        if (uVar5 != 0) {
          lVar14 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            lVar14 = lVar14 + 0x18;
          } while (lVar4 != lVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," > vectors (total ",0x12);
        GetNrVectors(this);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        iVar8 = *(int *)&(this->super_AlphaVectorPlanning).field_0x12c;
        uVar7 = iVar8 - 1;
        *(uint *)&(this->super_AlphaVectorPlanning).field_0x12c = uVar7;
      } while (0 < iVar8);
    }
    iVar8 = std::__cxx11::string::compare((char *)&this->_m_resultsFilename);
    if (iVar8 != 0) {
      AlphaVectorPlanning::ExportValueFunction(&this->_m_resultsFilename,local_d0,true);
    }
    (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[6])(local_c8,this)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_c8._0_8_,local_c8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Planner[h=",10);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: Vjb0=",8);
    pPVar11 = (this->super_AlphaVectorPlanning)._m_pu;
    if (pPVar11 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar11 = (this->super_AlphaVectorPlanning)._m_puShared.px;
    }
    pDVar3 = pPVar11->_m_DecPOMDP;
    belief = (StateDistribution *)
             (**(code **)(*(long *)((long)&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8)) +
                         0x50))((long)&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8));
    Belief::Belief(&local_f8,belief);
    dVar16 = BeliefValue::GetValue
                       ((BeliefInterface *)
                        (&local_f8.field_0x0 +
                        (long)(((pointer)(local_f8._0_8_ + -0xc0))->
                              super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl
                              .super__Vector_impl_data._M_finish),
                        (local_d0->
                        super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    poVar10 = std::ostream::_M_insert<double>(dVar16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    Belief::~Belief(&local_f8);
    if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,
                      (ulong)((long)&(((_Vector_base<AlphaVector,_std::allocator<AlphaVector>_> *)
                                      local_c8._16_8_)->_M_impl).super__Vector_impl_data._M_start +
                             1));
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)local_90);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)(local_90 + 0x18));
    AlphaVector::~AlphaVector((AlphaVector *)&local_58);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector(&local_a8);
  }
  return;
}

Assistant:

void MonahanPlanner::Plan()
{
    if(!MonahanPlanner::_m_initialized)
        Initialize();
    if(_m_alreadyComputed)
        return;
    _m_alreadyComputed=true;

    int h=GetPU()->GetHorizon(),nrA=GetPU()->GetNrJointActions(),
        nrS=GetPU()->GetNrStates();
    QFunctionsDiscrete Q;

    _m_qFunction=vector<QFunctionsDiscrete>(h);

    AlphaVector alpha(nrS);
    ValueFunctionPOMDPDiscrete Q0;

    ValueFunctionPOMDPDiscrete immR=GetImmediateRewardValueFunction();
    CheckMaxNrVectors(_m_maxNrAlphas.at(h-1),immR.size());

    _m_timeStep=h-1;
    while(_m_timeStep>=0)
    {
        if(_m_timeStep==h-1) // last time step, copy in immediate reward function
        {
            QFunctionsDiscrete Qs=ValueFunctionToQ(immR);
            for(int a=0;a!=nrA;a++)
                _m_qFunction[h-1].push_back(Qs[a]);
        }
        else
        {
            Q=BackupStage(_m_qFunction[_m_timeStep+1],_m_maxNrAlphas.at(_m_timeStep));

            CheckMaxNrVectors(_m_maxNrAlphas.at(_m_timeStep),GetNrVectors());
            for(int a=0;a!=nrA;a++)
                _m_qFunction[_m_timeStep].push_back(Q[a]);
        }

        cout << SoftPrintBrief() << "Planner: t " << _m_timeStep << " contains <";
        for(int a=0;a!=nrA;a++)
            cout << " " << _m_qFunction[_m_timeStep][a].size();
        cout << " > vectors (total "
             << GetNrVectors() << ")" << endl;
        _m_timeStep--;
    }

    if(_m_resultsFilename!="")
        ExportValueFunction(_m_resultsFilename,_m_qFunction);

    cout << SoftPrintBrief() << "Planner[h=" 
         << GetPU()->GetHorizon() << "]: Vjb0="
         << BeliefValue::GetValue(Belief(*GetPU()->GetDPOMDPD()->GetISD()),
                                  _m_qFunction[0])
         << endl;
}